

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O2

void __thiscall Lib::Deque<Kernel::Clause_*>::expand(Deque<Kernel::Clause_*> *this)

{
  size_t sVar1;
  Clause **__ptr;
  Clause **ppCVar2;
  Clause **ppCVar3;
  Clause **ppCVar4;
  size_t sVar5;
  size_t i;
  long lVar6;
  long lVar7;
  
  sVar1 = this->_capacity;
  lVar6 = 0;
  sVar5 = 0;
  if (this->_back < this->_front) {
    sVar5 = sVar1;
  }
  lVar7 = (long)this->_back + (sVar5 * 8 - (long)this->_front);
  ppCVar3 = (Clause **)Lib::alloc(sVar1 * 0x10);
  __ptr = this->_data;
  ppCVar4 = this->_front;
  ppCVar2 = this->_end;
  for (; lVar7 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    ppCVar3[lVar6] = *ppCVar4;
    ppCVar4 = ppCVar4 + 1;
    if (ppCVar4 == ppCVar2) {
      ppCVar4 = __ptr;
    }
  }
  Lib::free(__ptr);
  this->_data = ppCVar3;
  this->_front = ppCVar3;
  this->_back = (Clause **)(lVar7 + (long)ppCVar3);
  this->_end = ppCVar3 + sVar1 * 2;
  this->_capacity = sVar1 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }